

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::BinaryAssertionExpr::fromSyntax(BinarySequenceExprSyntax *syntax,ASTContext *context)

{
  SyntaxKind SVar1;
  Compilation *this;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *this_01;
  BinaryAssertionExpr *pBVar3;
  anon_class_8_1_898e4d05 check;
  SourceRange SVar4;
  BinaryAssertionOperator local_44;
  SourceRange local_40;
  AssertionExpr *this_00;
  
  this = ((context->scope).ptr)->compilation;
  iVar2 = AssertionExpr::bind((int)(syntax->left).ptr,(sockaddr *)context,0);
  this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
  iVar2 = AssertionExpr::bind((int)(syntax->right).ptr,(sockaddr *)context,0);
  SVar1 = (syntax->super_SequenceExprSyntax).super_SyntaxNode.kind;
  if (SVar1 == WithinSequenceExpr) {
    local_44 = Within;
LAB_003b75cb:
    AssertionExpr::requireSequence(this_00,context);
  }
  else {
    if (SVar1 == IntersectSequenceExpr) {
      local_44 = Intersect;
      goto LAB_003b75cb;
    }
    if (SVar1 == OrSequenceExpr) {
      local_44 = Or;
      goto LAB_003b75ed;
    }
    if (SVar1 != ThroughoutSequenceExpr) {
      local_44 = And;
      goto LAB_003b75ed;
    }
    local_44 = Throughout;
    if (((this_00->kind != Simple) || (*(char *)&this_00[2].syntax != '\0')) ||
       (**(int **)(this_00 + 1) == 0x27)) {
      SVar4 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
      this_01 = ASTContext::addDiag(context,(DiagCode)0x4c0008,SVar4);
      SVar4 = parsing::Token::range(&syntax->op);
      Diagnostic::operator<<(this_01,SVar4);
    }
  }
  AssertionExpr::requireSequence((AssertionExpr *)CONCAT44(extraout_var_00,iVar2),context);
LAB_003b75ed:
  local_40 = parsing::Token::range(&syntax->op);
  pBVar3 = BumpAllocator::
           emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
                     (&this->super_BumpAllocator,&local_44,this_00,
                      (AssertionExpr *)CONCAT44(extraout_var_00,iVar2),&local_40);
  return &pBVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& BinaryAssertionExpr::fromSyntax(const BinarySequenceExprSyntax& syntax,
                                               const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context);
    auto& right = bind(*syntax.right, context);

    // clang-format off
    BinaryAssertionOperator op;
    switch (syntax.kind) {
        case SyntaxKind::AndSequenceExpr: op = BinaryAssertionOperator::And; break;
        case SyntaxKind::OrSequenceExpr: op = BinaryAssertionOperator::Or; break;
        case SyntaxKind::IntersectSequenceExpr: op = BinaryAssertionOperator::Intersect; break;
        case SyntaxKind::ThroughoutSequenceExpr: op = BinaryAssertionOperator::Throughout; break;
        case SyntaxKind::WithinSequenceExpr: op = BinaryAssertionOperator::Within; break;
        default: SLANG_UNREACHABLE;
    }
    // clang-format on

    if (op == BinaryAssertionOperator::Throughout) {
        auto check = [&] {
            if (left.kind != AssertionExprKind::Simple)
                return false;

            auto& simple = left.as<SimpleAssertionExpr>();
            if (simple.repetition)
                return false;

            return simple.expr.kind != ExpressionKind::AssertionInstance;
        };

        if (!check()) {
            context.addDiag(diag::ThroughoutLhsInvalid, syntax.left->sourceRange())
                << syntax.op.range();
        }
        right.requireSequence(context);
    }
    else if (op != BinaryAssertionOperator::And && op != BinaryAssertionOperator::Or) {
        // The 'and' and 'or' operators may just be simple property references,
        // which is fine unless someone up above us decides they need sequences only.
        left.requireSequence(context);
        right.requireSequence(context);
    }

    return *comp.emplace<BinaryAssertionExpr>(op, left, right, syntax.op.range());
}